

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuzzingParameterSet.cpp
# Opt level: O2

void __thiscall FuzzingParameterSet::print_static_parameters(FuzzingParameterSet *this)

{
  string local_78;
  string local_58;
  string local_38;
  allocator<char> local_11;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Printing static hammering parameters:",
             (allocator<char> *)&local_58);
  Logger::log_info(&local_38,true);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"agg_intra_distance: %d",(allocator<char> *)&local_78);
  format_string<int>(&local_38,&local_58,this->agg_intra_distance);
  Logger::log_data(&local_38,true);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"N_sided dist.: %s",&local_11);
  get_dist_string_abi_cxx11_(&local_78,this);
  format_string<char_const*>(&local_38,&local_58,local_78._M_dataplus._M_p);
  Logger::log_data(&local_38,true);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"hammering_total_num_activations: %d",(allocator<char> *)&local_78)
  ;
  format_string<int>(&local_38,&local_58,this->hammering_total_num_activations);
  Logger::log_data(&local_38,true);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"max_row_no: %d",(allocator<char> *)&local_78);
  format_string<int>(&local_38,&local_58,this->max_row_no);
  Logger::log_data(&local_38,true);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void FuzzingParameterSet::print_static_parameters() const {
  Logger::log_info("Printing static hammering parameters:");
  Logger::log_data(format_string("agg_intra_distance: %d", agg_intra_distance));
  Logger::log_data(format_string("N_sided dist.: %s", get_dist_string().c_str()));
  Logger::log_data(format_string("hammering_total_num_activations: %d", hammering_total_num_activations));
  Logger::log_data(format_string("max_row_no: %d", max_row_no));
}